

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsondocument.cpp
# Opt level: O0

QVariant * __thiscall QJsonDocument::toVariant(QJsonDocument *this)

{
  long lVar1;
  bool bVar2;
  QCborValue *v;
  QJsonArray *in_RSI;
  QVariant *in_RDI;
  long in_FS_OFFSET;
  QCborContainerPrivate *container;
  QCborContainerPrivate *in_stack_ffffffffffffff68;
  QVariant *in_stack_ffffffffffffff70;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_> *
                     )0x48e8f2);
  if (bVar2) {
    v = &std::unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>::
         operator->((unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_> *)
                    0x48e90f)->value;
    QJsonPrivate::Value::container(v);
    std::unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>::operator->
              ((unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_> *)
               0x48e926);
    bVar2 = ::QCborValue::isArray((QCborValue *)0x48e92e);
    if (bVar2) {
      QJsonArray::QJsonArray((QJsonArray *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      QJsonArray::toVariantList(in_RSI);
      ::QVariant::QVariant(in_stack_ffffffffffffff70,(QList<QVariant> *)in_stack_ffffffffffffff68);
      QList<QVariant>::~QList((QList<QVariant> *)0x48e972);
      QJsonArray::~QJsonArray((QJsonArray *)0x48e97c);
    }
    else {
      QJsonObject::QJsonObject((QJsonObject *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      QJsonObject::toVariantMap((QJsonObject *)in_RSI);
      ::QVariant::QVariant
                (in_stack_ffffffffffffff70,(QMap<QString,_QVariant> *)in_stack_ffffffffffffff68);
      QMap<QString,_QVariant>::~QMap((QMap<QString,_QVariant> *)0x48e9e0);
      QJsonObject::~QJsonObject((QJsonObject *)0x48e9ea);
    }
  }
  else {
    ::QVariant::QVariant((QVariant *)0x48e900);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QJsonDocument::toVariant() const
{
    if (!d)
        return QVariant();

    QCborContainerPrivate *container = QJsonPrivate::Value::container(d->value);
    if (d->value.isArray())
        return QJsonArray(container).toVariantList();
    return QJsonObject(container).toVariantMap();
}